

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

CTcPrsNode * __thiscall
CTcPrsOpArith::eval_constant(CTcPrsOpArith *this,CTcPrsNode *left,CTcPrsNode *right)

{
  tc_constval_type_t tVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CTcConstVal *this_00;
  int *piVar3;
  undefined4 extraout_var_03;
  vbignum_t *pvVar4;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  char *pcVar5;
  uint promoted;
  vbignum_t b;
  vbignum_t a;
  int ov;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_04;
  
  iVar2 = (*(left->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])(left);
  if ((CONCAT44(extraout_var,iVar2) == 0) ||
     (iVar2 = (*(right->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])(right),
     CONCAT44(extraout_var_00,iVar2) == 0)) {
    return (CTcPrsNode *)0x0;
  }
  iVar2 = (*(left->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])(left);
  this_00 = (CTcConstVal *)CONCAT44(extraout_var_01,iVar2);
  iVar2 = (*(right->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])(right);
  piVar3 = (int *)CONCAT44(extraout_var_02,iVar2);
  tVar1 = this_00->typ_;
  iVar2 = *piVar3;
  if ((tVar1 == TC_CVT_INT) && (iVar2 == 3)) {
    iVar2 = (*(this->super_CTcPrsOpBin).super_CTcPrsOp._vptr_CTcPrsOp[3])
                      (this,(this_00->val_).intval_,*(undefined8 *)(piVar3 + 2),&ov);
    if (ov == 0) {
      this_00->typ_ = TC_CVT_INT;
      (this_00->val_).intval_ = CONCAT44(extraout_var_03,iVar2);
      return left;
    }
    vbignum_t::vbignum_t(&a,(this_00->val_).intval_);
    vbignum_t::vbignum_t(&b,*(long *)(piVar3 + 2));
    iVar2 = (*(this->super_CTcPrsOpBin).super_CTcPrsOp._vptr_CTcPrsOp[4])(this,&a,&b);
    pvVar4 = (vbignum_t *)CONCAT44(extraout_var_04,iVar2);
    if (pvVar4 != (vbignum_t *)0x0) {
      CTcConstVal::set_float(this_00,pvVar4,1);
      vbignum_t::~vbignum_t(pvVar4);
      operator_delete(pvVar4,8);
    }
  }
  else if ((tVar1 == TC_CVT_FLOAT) && (iVar2 == 0xd)) {
    vbignum_t::vbignum_t(&a,(this_00->val_).floatval_.txt_,(this_00->val_).floatval_.len_,0);
    vbignum_t::vbignum_t(&b,*(char **)(piVar3 + 2),*(size_t *)(piVar3 + 4),0);
    iVar2 = (*(this->super_CTcPrsOpBin).super_CTcPrsOp._vptr_CTcPrsOp[4])(this,&a,&b);
    pvVar4 = (vbignum_t *)CONCAT44(extraout_var_05,iVar2);
    if (pvVar4 != (vbignum_t *)0x0) {
      promoted = 0;
      if ((this_00->field_0x20 & 2) != 0) {
        promoted = (uint)piVar3[8] >> 1 & 1;
      }
      CTcConstVal::set_float(this_00,pvVar4,promoted);
      vbignum_t::~vbignum_t(pvVar4);
      operator_delete(pvVar4,8);
      CTcConstVal::demote_float(this_00);
    }
  }
  else if ((tVar1 == TC_CVT_FLOAT) && (iVar2 == 3)) {
    vbignum_t::vbignum_t(&a,(this_00->val_).floatval_.txt_,(this_00->val_).floatval_.len_,0);
    vbignum_t::vbignum_t(&b,*(long *)(piVar3 + 2));
    iVar2 = (*(this->super_CTcPrsOpBin).super_CTcPrsOp._vptr_CTcPrsOp[4])(this,&a,&b);
    pvVar4 = (vbignum_t *)CONCAT44(extraout_var_06,iVar2);
    if (pvVar4 != (vbignum_t *)0x0) {
      CTcConstVal::set_float(this_00,pvVar4,*(uint *)&this_00->field_0x20 >> 1 & 1);
      vbignum_t::~vbignum_t(pvVar4);
      operator_delete(pvVar4,8);
      CTcConstVal::demote_float(this_00);
    }
  }
  else {
    if ((tVar1 != TC_CVT_INT) || (iVar2 != 0xd)) {
      pcVar5 = CTcTokenizer::get_op_text((this->super_CTcPrsOpBin).op_tok_);
      CTcTokenizer::log_error(0x2b02,pcVar5);
      return (CTcPrsNode *)0x0;
    }
    vbignum_t::vbignum_t(&a,(this_00->val_).intval_);
    vbignum_t::vbignum_t(&b,*(char **)(piVar3 + 2),*(size_t *)(piVar3 + 4),0);
    iVar2 = (*(this->super_CTcPrsOpBin).super_CTcPrsOp._vptr_CTcPrsOp[4])(this,&a,&b);
    pvVar4 = (vbignum_t *)CONCAT44(extraout_var_07,iVar2);
    if (pvVar4 != (vbignum_t *)0x0) {
      CTcConstVal::set_float(this_00,pvVar4,(uint)piVar3[8] >> 1 & 1);
      vbignum_t::~vbignum_t(pvVar4);
      operator_delete(pvVar4,8);
      CTcConstVal::demote_float(this_00);
    }
  }
  vbignum_t::~vbignum_t(&b);
  vbignum_t::~vbignum_t(&a);
  return left;
}

Assistant:

CTcPrsNode *CTcPrsOpArith::eval_constant(CTcPrsNode *left,
                                         CTcPrsNode *right) const
{
    /* check for constants */
    if (left->is_const() && right->is_const())
    {
        CTcConstVal *c1 = left->get_const_val();
        CTcConstVal *c2 = right->get_const_val();
        tc_constval_type_t typ1 = c1->get_type();
        tc_constval_type_t typ2 = c2->get_type();

        /* check for ints, floats, or a combination */
        if (typ1 == TC_CVT_INT && typ2 == TC_CVT_INT)
        {
            /* calculate the int result */
            int ov;
            long r = calc_result(c1->get_val_int(), c2->get_val_int(), ov);

            /* on overflow, recalculate using BigNumbers */
            if (ov)
            {
                /* calculate the BigNumber result */
                vbignum_t a(c1->get_val_int());
                vbignum_t b(c2->get_val_int());
                vbignum_t *c = calc_result(a, b);

                /* if successful, assign it back to the left operand */
                if (c != 0)
                {
                    c1->set_float(c, TRUE);
                    delete c;
                }
            }
            else
            {
                /* success - assign the folded int to the left operand */
                c1->set_int(r);
            }
        }
        else if (typ1 == TC_CVT_FLOAT && typ2 == TC_CVT_FLOAT)
        {
            /* calculate the BigNumber result */
            vbignum_t a(c1->get_val_float(), c1->get_val_float_len(), 0);
            vbignum_t b(c2->get_val_float(), c2->get_val_float_len(), 0);
            vbignum_t *c = calc_result(a, b);

            /* assign it back to the left operand */
            if (c != 0)
            {
                /* save the value and delete the calculation result */
                c1->set_float(c, c1->is_promoted() && c2->is_promoted());
                delete c;

                /* check for possible demotion back to int */
                c1->demote_float();
            }
        }
        else if (typ1 == TC_CVT_FLOAT && typ2 == TC_CVT_INT)
        {
            /* calculate the BigNumber result */
            vbignum_t a(c1->get_val_float(), c1->get_val_float_len(), 0);
            vbignum_t b(c2->get_val_int());
            vbignum_t *c = calc_result(a, b);

            /* assign it back to the left operand */
            if (c != 0)
            {
                /* save the value and delete the calculation result */
                c1->set_float(c, c1->is_promoted());
                delete c;

                /* check for possible demotion back to int */
                c1->demote_float();
            }
        }
        else if (typ1 == TC_CVT_INT && typ2 == TC_CVT_FLOAT)
        {
            /* calculate the BigNumber result */
            vbignum_t a(c1->get_val_int());
            vbignum_t b(c2->get_val_float(), c2->get_val_float_len(), 0);
            vbignum_t *c = calc_result(a, b);

            /* assign it back to the left operand */
            if (c != 0)
            {
                /* save the value and delete the calculation result */
                c1->set_float(c, c2->is_promoted());
                delete c;

                /* check for possible demotion back to int */
                c1->demote_float();
            }
        }
        else
        {
            /* incompatible types - log an error */
            G_tok->log_error(TCERR_CONST_BINARY_REQ_NUM,
                             G_tok->get_op_text(get_op_tok()));
            return 0;
        }

        /* return the updated left value */
        return left;
    }
    else
    {
        /* 
         *   one or the other is non-constant, so we can't fold the
         *   expression - return null to so indicate 
         */
        return 0;
    }
}